

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_device__post_init_setup(ma_device *pDevice,ma_device_type deviceType)

{
  uint uVar1;
  ma_format mVar2;
  uint uVar3;
  anon_struct_10712_14_e1e1adf9_for_playback *paVar4;
  ma_uint32 mVar5;
  ma_device_type mVar6;
  ma_result mVar7;
  ma_channel *in_RAX;
  ma_channel *extraout_RAX;
  ma_channel *extraout_RAX_00;
  size_t sVar8;
  ulong uVar9;
  ma_device_type mVar10;
  ma_data_converter_config converterConfig;
  ma_data_converter_config local_10a8;
  
  uVar1 = deviceType - ma_device_type_capture;
  if (uVar1 < 3) {
    if ((pDevice->capture).format == ma_format_unknown) {
      mVar2 = (pDevice->capture).internalFormat;
      in_RAX = (ma_channel *)(ulong)mVar2;
      (pDevice->capture).format = mVar2;
    }
    if ((pDevice->capture).channels == 0) {
      uVar3 = (pDevice->capture).internalChannels;
      in_RAX = (ma_channel *)(ulong)uVar3;
      (pDevice->capture).channels = uVar3;
    }
    if ((pDevice->capture).channelMap[0] == '\0') {
      uVar3 = (pDevice->capture).channels;
      uVar9 = (ulong)uVar3;
      if (0x20 < uVar9) {
        __assert_fail("pDevice->capture.channels <= 32",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/mackron/miniaudio.h"
                      ,0x7e01,"ma_result ma_device__post_init_setup(ma_device *, ma_device_type)");
      }
      in_RAX = (pDevice->capture).channelMap;
      if ((pDevice->capture).internalChannels == uVar3) {
        if (uVar9 != 0) {
          in_RAX = (ma_channel *)memcpy(in_RAX,(pDevice->capture).internalChannelMap,uVar9);
        }
      }
      else if ((pDevice->capture).channelMixMode == ma_channel_mix_mode_simple) {
        in_RAX = (ma_channel *)memset(in_RAX,0,uVar9);
      }
      else {
        ma_get_standard_channel_map(ma_standard_channel_map_default,uVar3,in_RAX);
        in_RAX = extraout_RAX;
      }
    }
  }
  mVar10 = deviceType & ~ma_device_type_capture;
  if (mVar10 == ma_device_type_playback) {
    if ((pDevice->playback).format == ma_format_unknown) {
      mVar2 = (pDevice->playback).internalFormat;
      in_RAX = (ma_channel *)(ulong)mVar2;
      (pDevice->playback).format = mVar2;
    }
    if ((pDevice->playback).channels == 0) {
      uVar3 = (pDevice->playback).internalChannels;
      in_RAX = (ma_channel *)(ulong)uVar3;
      (pDevice->playback).channels = uVar3;
    }
    if ((pDevice->playback).channelMap[0] == '\0') {
      uVar3 = (pDevice->playback).channels;
      uVar9 = (ulong)uVar3;
      if (0x20 < uVar9) {
        __assert_fail("pDevice->playback.channels <= 32",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/mackron/miniaudio.h"
                      ,0x7e16,"ma_result ma_device__post_init_setup(ma_device *, ma_device_type)");
      }
      in_RAX = (pDevice->playback).channelMap;
      if ((pDevice->playback).internalChannels == uVar3) {
        if (uVar9 != 0) {
          in_RAX = (ma_channel *)memcpy(in_RAX,(pDevice->playback).internalChannelMap,uVar9);
        }
      }
      else if ((pDevice->playback).channelMixMode == ma_channel_mix_mode_simple) {
        in_RAX = (ma_channel *)memset(in_RAX,0,uVar9);
      }
      else {
        ma_get_standard_channel_map(ma_standard_channel_map_default,uVar3,in_RAX);
        in_RAX = extraout_RAX_00;
      }
    }
  }
  mVar5 = (ma_uint32)in_RAX;
  if (pDevice->sampleRate == 0) {
    paVar4 = &pDevice->playback;
    if (uVar1 < 3) {
      paVar4 = (anon_struct_10712_14_e1e1adf9_for_playback *)&pDevice->capture;
    }
    mVar5 = paVar4->internalSampleRate;
    pDevice->sampleRate = mVar5;
  }
  if (uVar1 < 3) {
    memset(&local_10a8,0,0x1080);
    local_10a8.resampling.linear.lpfOrder = 1;
    local_10a8.resampling.linear.lpfNyquistFactor = 1.0;
    local_10a8.resampling.speex.quality = 3;
    local_10a8.formatIn = (pDevice->capture).internalFormat;
    local_10a8.channelsIn = (pDevice->capture).internalChannels;
    local_10a8.sampleRateIn = (pDevice->capture).internalSampleRate;
    if (local_10a8.channelsIn != 0) {
      sVar8 = 0x20;
      if (local_10a8.channelsIn < 0x20) {
        sVar8 = (size_t)local_10a8.channelsIn;
      }
      memcpy(local_10a8.channelMapIn,(pDevice->capture).internalChannelMap,sVar8);
    }
    local_10a8.formatOut = (pDevice->capture).format;
    local_10a8.channelsOut = (pDevice->capture).channels;
    local_10a8.sampleRateOut = pDevice->sampleRate;
    if (local_10a8.channelsOut != 0) {
      sVar8 = 0x20;
      if (local_10a8.channelsOut < 0x20) {
        sVar8 = (size_t)local_10a8.channelsOut;
      }
      memcpy(local_10a8.channelMapOut,(pDevice->capture).channelMap,sVar8);
    }
    local_10a8.channelMixMode = (pDevice->capture).channelMixMode;
    local_10a8.resampling.allowDynamicSampleRate = 0;
    local_10a8.resampling.algorithm = (pDevice->resampling).algorithm;
    local_10a8.resampling.linear.lpfOrder = (pDevice->resampling).linear.lpfOrder;
    local_10a8.resampling.speex.quality = (pDevice->resampling).speex.quality;
    mVar6 = ma_data_converter_init(&local_10a8,&(pDevice->capture).converter);
    mVar6 = mVar6 | mVar10 ^ ma_device_type_playback;
    if (mVar6 != 0) {
      return mVar6;
    }
  }
  else if (mVar10 != ma_device_type_playback) {
    return mVar5;
  }
  memset(&local_10a8,0,0x1080);
  local_10a8.resampling.linear.lpfOrder = 1;
  local_10a8.resampling.linear.lpfNyquistFactor = 1.0;
  local_10a8.resampling.speex.quality = 3;
  local_10a8.formatIn = (pDevice->playback).format;
  local_10a8.channelsIn = (pDevice->playback).channels;
  local_10a8.sampleRateIn = pDevice->sampleRate;
  if (local_10a8.channelsIn != 0) {
    sVar8 = 0x20;
    if (local_10a8.channelsIn < 0x20) {
      sVar8 = (size_t)local_10a8.channelsIn;
    }
    memcpy(local_10a8.channelMapIn,(pDevice->playback).channelMap,sVar8);
  }
  local_10a8.formatOut = (pDevice->playback).internalFormat;
  local_10a8.channelsOut = (pDevice->playback).internalChannels;
  local_10a8.sampleRateOut = (pDevice->playback).internalSampleRate;
  if (local_10a8.channelsOut != 0) {
    sVar8 = 0x20;
    if (local_10a8.channelsOut < 0x20) {
      sVar8 = (size_t)local_10a8.channelsOut;
    }
    memcpy(local_10a8.channelMapOut,(pDevice->playback).internalChannelMap,sVar8);
  }
  local_10a8.channelMixMode = (pDevice->playback).channelMixMode;
  local_10a8.resampling.allowDynamicSampleRate = 0;
  local_10a8.resampling.algorithm = (pDevice->resampling).algorithm;
  local_10a8.resampling.linear.lpfOrder = (pDevice->resampling).linear.lpfOrder;
  local_10a8.resampling.speex.quality = (pDevice->resampling).speex.quality;
  mVar7 = ma_data_converter_init(&local_10a8,&(pDevice->playback).converter);
  return mVar7;
}

Assistant:

static ma_result ma_device__post_init_setup(ma_device* pDevice, ma_device_type deviceType)
{
    ma_result result;

    MA_ASSERT(pDevice != NULL);

    if (deviceType == ma_device_type_capture || deviceType == ma_device_type_duplex || deviceType == ma_device_type_loopback) {
        if (pDevice->capture.format == ma_format_unknown) {
            pDevice->capture.format = pDevice->capture.internalFormat;
        }
        if (pDevice->capture.channels == 0) {
            pDevice->capture.channels = pDevice->capture.internalChannels;
        }
        if (pDevice->capture.channelMap[0] == MA_CHANNEL_NONE) {
            MA_ASSERT(pDevice->capture.channels <= MA_MAX_CHANNELS);
            if (pDevice->capture.internalChannels == pDevice->capture.channels) {
                ma_channel_map_copy(pDevice->capture.channelMap, pDevice->capture.internalChannelMap, pDevice->capture.channels);
            } else {
                if (pDevice->capture.channelMixMode == ma_channel_mix_mode_simple) {
                    ma_channel_map_init_blank(pDevice->capture.channels, pDevice->capture.channelMap);
                } else {
                    ma_get_standard_channel_map(ma_standard_channel_map_default, pDevice->capture.channels, pDevice->capture.channelMap);
                }
            }
        }
    }

    if (deviceType == ma_device_type_playback || deviceType == ma_device_type_duplex) {
        if (pDevice->playback.format == ma_format_unknown) {
            pDevice->playback.format = pDevice->playback.internalFormat;
        }
        if (pDevice->playback.channels == 0) {
            pDevice->playback.channels = pDevice->playback.internalChannels;
        }
        if (pDevice->playback.channelMap[0] == MA_CHANNEL_NONE) {
            MA_ASSERT(pDevice->playback.channels <= MA_MAX_CHANNELS);
            if (pDevice->playback.internalChannels == pDevice->playback.channels) {
                ma_channel_map_copy(pDevice->playback.channelMap, pDevice->playback.internalChannelMap, pDevice->playback.channels);
            } else {
                if (pDevice->playback.channelMixMode == ma_channel_mix_mode_simple) {
                    ma_channel_map_init_blank(pDevice->playback.channels, pDevice->playback.channelMap);
                } else {
                    ma_get_standard_channel_map(ma_standard_channel_map_default, pDevice->playback.channels, pDevice->playback.channelMap);
                }
            }
        }
    }

    if (pDevice->sampleRate == 0) {
        if (deviceType == ma_device_type_capture || deviceType == ma_device_type_duplex || deviceType == ma_device_type_loopback) {
            pDevice->sampleRate = pDevice->capture.internalSampleRate;
        } else {
            pDevice->sampleRate = pDevice->playback.internalSampleRate;
        }
    }

    /* Data converters. */
    if (deviceType == ma_device_type_capture || deviceType == ma_device_type_duplex || deviceType == ma_device_type_loopback) {
        /* Converting from internal device format to client format. */
        ma_data_converter_config converterConfig = ma_data_converter_config_init_default();
        converterConfig.formatIn                   = pDevice->capture.internalFormat;
        converterConfig.channelsIn                 = pDevice->capture.internalChannels;
        converterConfig.sampleRateIn               = pDevice->capture.internalSampleRate;
        ma_channel_map_copy(converterConfig.channelMapIn, pDevice->capture.internalChannelMap, ma_min(pDevice->capture.internalChannels, MA_MAX_CHANNELS));
        converterConfig.formatOut                  = pDevice->capture.format;
        converterConfig.channelsOut                = pDevice->capture.channels;
        converterConfig.sampleRateOut              = pDevice->sampleRate;
        ma_channel_map_copy(converterConfig.channelMapOut, pDevice->capture.channelMap, ma_min(pDevice->capture.channels, MA_MAX_CHANNELS));
        converterConfig.channelMixMode             = pDevice->capture.channelMixMode;
        converterConfig.resampling.allowDynamicSampleRate = MA_FALSE;
        converterConfig.resampling.algorithm       = pDevice->resampling.algorithm;
        converterConfig.resampling.linear.lpfOrder = pDevice->resampling.linear.lpfOrder;
        converterConfig.resampling.speex.quality   = pDevice->resampling.speex.quality;

        result = ma_data_converter_init(&converterConfig, &pDevice->capture.converter);
        if (result != MA_SUCCESS) {
            return result;
        }
    }

    if (deviceType == ma_device_type_playback || deviceType == ma_device_type_duplex) {
        /* Converting from client format to device format. */
        ma_data_converter_config converterConfig = ma_data_converter_config_init_default();
        converterConfig.formatIn                   = pDevice->playback.format;
        converterConfig.channelsIn                 = pDevice->playback.channels;
        converterConfig.sampleRateIn               = pDevice->sampleRate;
        ma_channel_map_copy(converterConfig.channelMapIn, pDevice->playback.channelMap, ma_min(pDevice->playback.channels, MA_MAX_CHANNELS));
        converterConfig.formatOut                  = pDevice->playback.internalFormat;
        converterConfig.channelsOut                = pDevice->playback.internalChannels;
        converterConfig.sampleRateOut              = pDevice->playback.internalSampleRate;
        ma_channel_map_copy(converterConfig.channelMapOut, pDevice->playback.internalChannelMap, ma_min(pDevice->playback.internalChannels, MA_MAX_CHANNELS));
        converterConfig.channelMixMode             = pDevice->playback.channelMixMode;
        converterConfig.resampling.allowDynamicSampleRate = MA_FALSE;
        converterConfig.resampling.algorithm       = pDevice->resampling.algorithm;
        converterConfig.resampling.linear.lpfOrder = pDevice->resampling.linear.lpfOrder;
        converterConfig.resampling.speex.quality   = pDevice->resampling.speex.quality;

        result = ma_data_converter_init(&converterConfig, &pDevice->playback.converter);
        if (result != MA_SUCCESS) {
            return result;
        }
    }

    return MA_SUCCESS;
}